

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

int ParseExpCmp(char **p,aint *nval)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  aint right;
  undefined8 local_38;
  uint uVar4;
  
  local_38 = in_RAX;
  iVar1 = ParseExpMinMax(p,(aint *)((long)&local_38 + 4));
  if (iVar1 == 0) {
LAB_00122b64:
    iVar1 = 0;
  }
  else {
    iVar3 = local_38._4_4_;
    iVar1 = need(p,"<=>=< > ");
    while (iVar1 != 0) {
      iVar2 = ParseExpMinMax(p,(aint *)&local_38);
      if (iVar2 == 0) goto LAB_00122b64;
      if (iVar1 < 0x79) {
        if (iVar1 == 0x3c) {
          uVar4 = (uint)(iVar3 < (int)local_38);
          goto LAB_00122b3a;
        }
        if (iVar1 == 0x3e) {
          uVar4 = (uint)((int)local_38 < iVar3);
          goto LAB_00122b3a;
        }
LAB_00122b11:
        Error("internal error",(char *)0x0,FATAL);
      }
      else {
        if (iVar1 == 0x79) {
          uVar4 = (uint)(iVar3 <= (int)local_38);
        }
        else {
          if (iVar1 != 0x7b) goto LAB_00122b11;
          uVar4 = (uint)((int)local_38 <= iVar3);
        }
LAB_00122b3a:
        iVar3 = -uVar4;
      }
      iVar1 = need(p,"<=>=< > ");
    }
    *nval = iVar3;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int ParseExpCmp(char*& p, aint& nval) {
	aint left, right;
	int oper;
	if (!ParseExpMinMax(p, left)) return 0;
	while ((oper = need(p, "<=>=< > "))) {
		if (!ParseExpMinMax(p, right)) return 0;
		switch (oper) {
		case '<':
			left = -(left < right); break;
		case '>':
			left = -(left > right); break;
		case '<'+'=':
			left = -(left <= right); break;
		case '>'+'=':
			left = -(left >= right); break;
		default: Error("internal error", nullptr, FATAL); break;	// unreachable
		}
	}
	nval = left;
	return 1;
}